

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesAlbum.cpp
# Opt level: O2

void __thiscall ResourcesAlbum::clearLeafsContent(ResourcesAlbum *this)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->leafToContentWrapper)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->leafToContentWrapper)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<ResourceLeafWrapper_*,_std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>,_std::_Select1st<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>,_std::less<ResourceLeafWrapper_*>,_std::allocator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>_>
  ::clear(&(this->leafToContentWrapper)._M_t);
  return;
}

Assistant:

void ResourcesAlbum::clearLeafsContent()
{
    std::map<ResourceLeafWrapper*, ResourceContentWrapper*>::iterator itr;
    for (itr = leafToContentWrapper.begin(); itr != leafToContentWrapper.end(); ++itr) {
        ResourceContentWrapper* cw = itr->second;
        delete cw;
    }
    leafToContentWrapper.clear();
}